

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divdif.cpp
# Opt level: O0

void dif_shift_zero(int nd,double *xd,double *yd)

{
  int local_28;
  int local_24;
  int j;
  int i;
  double *yd_local;
  double *xd_local;
  int nd_local;
  
  for (local_28 = 1; local_28 <= nd; local_28 = local_28 + 1) {
    for (local_24 = nd + -2; -1 < local_24; local_24 = local_24 + -1) {
      yd[local_24] = -xd[local_24] * yd[local_24 + 1] + yd[local_24];
    }
    for (local_24 = nd + -1; 0 < local_24; local_24 = local_24 + -1) {
      xd[local_24] = xd[local_24 + -1];
    }
    *xd = 0.0;
  }
  return;
}

Assistant:

void dif_shift_zero ( int nd, double xd[], double yd[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIF_SHIFT_ZERO shifts a divided difference table so all abscissas are zero.
//
//  Discussion:
//
//    When the abscissas are changed, the coefficients naturally
//    must also be changed.
//
//    The resulting pair (XD, YD) still represents the
//    same polynomial, but the entries in YD are now the
//    standard polynomial coefficients.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 November 2011
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Carl deBoor,
//    A Practical Guide to Splines,
//    Springer, 2001,
//    ISBN: 0387953663,
//    LC: QA1.A647.v27.
//
//  Parameters:
//
//    Input, int ND, the length of the XD and YD arrays.
//
//    Input/output, double XD[ND], the X values that correspond to the
//    divided difference table.  On output, XD contains only zeroes.
//
//    Input/output, double YD[ND], the divided difference table
//    for the polynomial.  On output, YD is also
//    the coefficient array for the standard representation
//    of the polynomial.
//
{
  int i;
  int j;

  for ( j = 1; j <= nd; j++ )
  {
//
//  Recompute the divided difference coefficients.
//
    for ( i = nd - 2; 0 <= i; i-- )
    {
      yd[i] = yd[i] - xd[i] * yd[i+1];
    }
//
//  Shift the XD values up one position and insert XV.
//
    for ( i = nd - 1; 0 < i; i-- )
    {
      xd[i] = xd[i-1];
    }
    xd[0] = 0.0;
  }

  return;
}